

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::set_status
          (ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,
          HalfedgeHandle _heh,StatusInfo *_status)

{
  int iVar1;
  ArrayKernel *this_00;
  
  this_00 = (ArrayKernel *)this->mesh_;
  iVar1 = *(int *)(this_00 + 0xac);
  if (iVar1 < 0) {
    ArrayKernel::request_halfedge_status(this_00);
    this_00 = (ArrayKernel *)this->mesh_;
    iVar1 = *(int *)(this_00 + 0xac);
  }
  *(value_type_conflict2 *)
   (*(long *)(*(long *)(*(long *)(this_00 + 0x30) + (long)iVar1 * 8) + 0x30) +
   (long)(int)_heh.super_BaseHandle.idx_ * 4) = _status->status_;
  return;
}

Assistant:

virtual void set_status(HalfedgeHandle _heh, const OpenMesh::Attributes::StatusInfo& _status) override
  {
    if (!mesh_.has_halfedge_status())
      mesh_.request_halfedge_status();
    mesh_.status(_heh) = _status;
  }